

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupLevelized(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  int *__dest;
  Aig_Obj_t **ppAVar7;
  Aig_Obj_t *pAVar8;
  Vec_Vec_t *__ptr;
  ulong uVar9;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  Tim_Man_t *pTVar12;
  void *pvVar13;
  Aig_Obj_t *p1;
  long lVar14;
  long lVar15;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  iVar3 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar3;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar3 = pVVar2->nSize;
    pVVar6->nSize = iVar3;
    pVVar6->nCap = iVar3;
    if ((long)iVar3 == 0) {
      sVar4 = 0;
      __dest = (int *)0x0;
    }
    else {
      sVar4 = (long)iVar3 << 2;
      __dest = (int *)malloc(sVar4);
    }
    pVVar6->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,sVar4);
    p_00->vFlopNums = pVVar6;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    ppAVar7 = (Aig_Obj_t **)calloc(1,(long)p->vObjs->nSize << 3);
    p_00->pEquivs = ppAVar7;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    ppAVar7 = (Aig_Obj_t **)calloc(1,(long)p->vObjs->nSize << 3);
    p_00->pReprs = ppAVar7;
  }
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      pvVar13 = pVVar11->pArray[lVar15];
      pAVar8 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar8->field_0x18 =
           *(ulong *)&pAVar8->field_0x18 & 0xff000000ffffffff |
           *(ulong *)((long)pvVar13 + 0x18) & 0xffffff00000000;
      *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar8;
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCis;
    } while (lVar15 < pVVar11->nSize);
  }
  __ptr = Aig_ManLevelize(p);
  uVar10 = (ulong)(uint)__ptr->nSize;
  if (0 < __ptr->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar10 <= lVar15) {
LAB_0062f3c2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar13 = __ptr->pArray[lVar15];
      if (0 < *(int *)((long)pvVar13 + 4)) {
        lVar14 = 0;
        do {
          uVar10 = *(ulong *)(*(long *)((long)pvVar13 + 8) + lVar14 * 8);
          if ((uVar10 & 1) != 0) goto LAB_0062f3a3;
          uVar9 = *(ulong *)(uVar10 + 8) & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar8 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(uVar10 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          uVar9 = *(ulong *)(uVar10 + 0x10) & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)(uVar10 + 0x10) & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          pAVar8 = Aig_Oper(p_00,pAVar8,p1,*(Aig_Type_t *)(uVar10 + 0x18) & AIG_OBJ_VOID);
          *(Aig_Obj_t **)(uVar10 + 0x28) = pAVar8;
          uVar10 = (ulong)__ptr->nSize;
          if ((long)uVar10 <= lVar15) goto LAB_0062f3c2;
          lVar14 = lVar14 + 1;
          pvVar13 = __ptr->pArray[lVar15];
        } while (lVar14 < *(int *)((long)pvVar13 + 4));
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar10);
    if (0 < (int)uVar10) {
      lVar15 = 0;
      do {
        pvVar13 = __ptr->pArray[lVar15];
        if (pvVar13 != (void *)0x0) {
          if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar13 + 8));
          }
          free(pvVar13);
          uVar10 = (ulong)(uint)__ptr->nSize;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)uVar10);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      pvVar13 = pVVar11->pArray[lVar15];
      if (((ulong)pvVar13 & 1) != 0) {
LAB_0062f3a3:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar10 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
      if (uVar10 == 0) {
        pAVar8 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar10 + 0x28));
      }
      pAVar8 = Aig_ObjCreateCo(p_00,pAVar8);
      *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar8;
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCos;
    } while (lVar15 < pVVar11->nSize);
  }
  if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
    __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDup.c"
                  ,0x32b,"Aig_Man_t *Aig_ManDupLevelized(Aig_Man_t *)");
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar12 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar12;
  }
  iVar3 = Aig_ManCheck(p_00);
  if (iVar3 == 0) {
    puts("Aig_ManDupLevelized(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupLevelized( Aig_Man_t * p )
{
    Vec_Vec_t * vLevels;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
    {
        pNew->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    if ( p->pReprs )
    {
        pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    vLevels = Aig_ManLevelize( p );
    Vec_VecForEachEntry( Aig_Obj_t *, vLevels, pObj, i, k )
    {
        pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        pObj->pData = pObjNew;
    }
    Vec_VecFree( vLevels );
    // duplicate POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
//    if ( (nNodes = Aig_ManCleanup( pNew )) )
//        printf( "Aig_ManDupLevelized(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupLevelized(): The check has failed.\n" );
    return pNew;
}